

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_output_commitment_init
              (wally_tx_output *output,uchar *asset,size_t asset_len,uchar *value,size_t value_len,
              uchar *nonce,size_t nonce_len,uchar *surjectionproof,size_t surjectionproof_len,
              uchar *rangeproof,size_t rangeproof_len,_Bool is_elements)

{
  _Bool _Var1;
  bool local_61;
  uchar *local_60;
  uchar *new_nonce;
  uchar *new_value;
  uchar *new_asset;
  int ret;
  _Bool is_elements_local;
  uchar *nonce_local;
  size_t value_len_local;
  uchar *value_local;
  size_t asset_len_local;
  uchar *asset_local;
  wally_tx_output *output_local;
  
  new_asset._7_1_ = is_elements;
  new_value = (uchar *)0x0;
  new_nonce = (uchar *)0x0;
  local_60 = (uchar *)0x0;
  if (((((output == (wally_tx_output *)0x0) || ((asset != (uchar *)0x0) != (asset_len == 0x21))) ||
       (local_61 = value_len == 0x21 || value_len == 9, (value != (uchar *)0x0) != local_61)) ||
      (((nonce != (uchar *)0x0) != (nonce_len == 0x21) ||
       ((surjectionproof != (uchar *)0x0) != (surjectionproof_len != 0))))) ||
     ((rangeproof != (uchar *)0x0) != (rangeproof_len != 0))) {
    output_local._4_4_ = -2;
  }
  else {
    _ret = nonce;
    nonce_local = (uchar *)value_len;
    value_len_local = (size_t)value;
    value_local = (uchar *)asset_len;
    asset_len_local = (size_t)asset;
    asset_local = (uchar *)output;
    _Var1 = clone_bytes(&new_value,asset,asset_len);
    if (((_Var1) &&
        (_Var1 = clone_bytes(&new_nonce,(uchar *)value_len_local,(size_t)nonce_local), _Var1)) &&
       (_Var1 = clone_bytes(&local_60,_ret,nonce_len), _Var1)) {
      new_asset._0_4_ =
           tx_elements_output_proof_init
                     ((wally_tx_output *)asset_local,surjectionproof,surjectionproof_len,rangeproof,
                      rangeproof_len);
    }
    else {
      new_asset._0_4_ = -3;
    }
    if ((int)new_asset == 0) {
      *(uchar **)(asset_local + 0x20) = new_value;
      *(uchar **)(asset_local + 0x28) = value_local;
      *(uchar **)(asset_local + 0x30) = new_nonce;
      *(uchar **)(asset_local + 0x38) = nonce_local;
      *(uchar **)(asset_local + 0x40) = local_60;
      *(size_t *)(asset_local + 0x48) = nonce_len;
      if ((new_asset._7_1_ & 1) != 0) {
        asset_local[0x18] = asset_local[0x18] | 1;
      }
      output_local._4_4_ = 0;
    }
    else {
      clear_and_free(new_value,(size_t)value_local);
      clear_and_free(new_nonce,(size_t)nonce_local);
      clear_and_free(local_60,nonce_len);
      output_local._4_4_ = (int)new_asset;
    }
  }
  return output_local._4_4_;
}

Assistant:

static int tx_elements_output_commitment_init(
    struct wally_tx_output *output,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    bool is_elements)
{
#ifdef BUILD_ELEMENTS
    int ret;
    unsigned char *new_asset = NULL, *new_value = NULL, *new_nonce = NULL;
#endif

    if (!output ||
        BYTES_INVALID_N(asset, asset_len, WALLY_TX_ASSET_CT_ASSET_LEN) ||
        ((value != NULL) != (value_len == WALLY_TX_ASSET_CT_VALUE_LEN ||
                             value_len == WALLY_TX_ASSET_CT_VALUE_UNBLIND_LEN)) ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_CT_NONCE_LEN) ||
        BYTES_INVALID(surjectionproof, surjectionproof_len) ||
        BYTES_INVALID(rangeproof, rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_asset, asset, asset_len) ||
        !clone_bytes(&new_value, value, value_len) ||
        !clone_bytes(&new_nonce, nonce, nonce_len))
        ret = WALLY_ENOMEM;
    else
        ret = tx_elements_output_proof_init(output,
                                            surjectionproof,
                                            surjectionproof_len,
                                            rangeproof,
                                            rangeproof_len);
    if (ret != WALLY_OK) {
        clear_and_free(new_asset, asset_len);
        clear_and_free(new_value, value_len);
        clear_and_free(new_nonce, nonce_len);
        return ret;
    }

    output->asset = new_asset;
    output->asset_len = asset_len;
    output->value = new_value;
    output->value_len = value_len;
    output->nonce = new_nonce;
    output->nonce_len = nonce_len;
#endif /* BUILD_ELEMENTS */

    if (is_elements)
        output->features |= WALLY_TX_IS_ELEMENTS;

    return WALLY_OK;
}